

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<unsigned_long> *this;
  allocator<long> *this_00;
  long lVar1;
  ulong uVar2;
  size_type sVar3;
  ostream *poVar4;
  pointer puVar5;
  bool bVar6;
  __type _Var7;
  double dVar8;
  undefined1 auVar9 [16];
  allocator local_571;
  string local_570 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_550;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_538;
  vector<int,_std::allocator<int>_> local_500;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_4e8;
  vector<long,_std::allocator<long>_> local_4d0;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_4b8;
  int local_47c;
  undefined1 local_478 [8];
  vector<int,_std::allocator<int>_> label;
  string local_458 [6];
  bool res;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_438;
  WeightMap local_400;
  WeightMap weight;
  value_type_conflict1 local_3f0;
  undefined1 local_3e8 [8];
  vector<long,_std::allocator<long>_> dist;
  undefined1 local_3c8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> pred;
  unsigned_long N;
  Graph local_3a0;
  allocator local_361;
  string local_360 [32];
  Graph local_340;
  allocator local_301;
  string local_300 [39];
  no_property local_2d9;
  undefined1 local_2d8 [8];
  Graph G_2;
  string local_298 [32];
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_278;
  undefined1 local_240 [8];
  Graph G_1;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [32];
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_1b8;
  undefined1 local_180 [8];
  Graph G;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [48];
  variables_map local_c0 [8];
  variables_map args;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_b0 [148];
  undefined4 local_1c;
  char **ppcStack_18;
  int INF;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_1c = 0x7fffffff;
  nodes = 100;
  times = 1;
  minWeight = -100;
  maxWeight = 10000;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  parseArguments((int)local_c0,(char **)(ulong)(uint)argc);
  if (edges == 0) {
    lVar1 = nodes * 0x14;
    auVar9._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar9._0_8_ = lVar1;
    auVar9._12_4_ = 0x45300000;
    _Var7 = std::log10<unsigned_long>(nodes);
    dVar8 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * _Var7;
    uVar2 = (ulong)dVar8;
    edges = uVar2 | (long)(dVar8 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"test",&local_f1);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_b0,(key_type *)local_f0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  if (sVar3 == 0) {
    std::allocator<char>::allocator();
    G.m_property.px._6_1_ = 0;
    G.m_property.px._5_1_ = 0;
    std::__cxx11::string::string(local_118,"benchmark",&local_119);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_b0,(key_type *)local_118);
    bVar6 = false;
    if (sVar3 != 0) {
      std::allocator<char>::allocator();
      G.m_property.px._6_1_ = 1;
      std::__cxx11::string::string(local_140,"random",(allocator *)((long)&G.m_property.px + 7));
      G.m_property.px._5_1_ = 1;
      sVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(local_b0,(key_type *)local_140);
      bVar6 = sVar3 != 0;
    }
    if ((G.m_property.px._5_1_ & 1) != 0) {
      std::__cxx11::string::~string(local_140);
    }
    if ((G.m_property.px._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&G.m_property.px + 7));
    }
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    if (bVar6) {
      createRandomGraph((Graph *)local_180,nodes,edges,minWeight,maxWeight);
      poVar4 = std::operator<<((ostream *)&std::cout,"[i] Benchmark random graph ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,nodes);
      poVar4 = std::operator<<(poVar4,"x");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,edges);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      boost::
      adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
      ::adjacency_list(&local_1b8,
                       (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                        *)local_180);
      benchmark(&local_1b8,times);
      boost::
      adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
      ::~adjacency_list(&local_1b8);
      boost::
      adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
      ::~adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                         *)local_180);
    }
    else {
      std::allocator<char>::allocator();
      G_1.m_property.px._6_1_ = 0;
      G_1.m_property.px._5_1_ = 0;
      std::__cxx11::string::string(local_1d8,"benchmark",&local_1d9);
      sVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(local_b0,(key_type *)local_1d8);
      bVar6 = false;
      if (sVar3 != 0) {
        std::allocator<char>::allocator();
        G_1.m_property.px._6_1_ = 1;
        std::__cxx11::string::string(local_200,"grid",(allocator *)((long)&G_1.m_property.px + 7));
        G_1.m_property.px._5_1_ = 1;
        sVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count(local_b0,(key_type *)local_200);
        bVar6 = sVar3 != 0;
      }
      if ((G_1.m_property.px._5_1_ & 1) != 0) {
        std::__cxx11::string::~string(local_200);
      }
      if ((G_1.m_property.px._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&G_1.m_property.px + 7));
      }
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      if (bVar6) {
        createGridGraph((Graph *)local_240,(int)nodes,minWeight,maxWeight);
        poVar4 = std::operator<<((ostream *)&std::cout,"[i] Benchmark grid graph ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,nodes);
        poVar4 = std::operator<<(poVar4,"x");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,nodes);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        boost::
        adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
        ::adjacency_list(&local_278,
                         (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                          *)local_240);
        benchmark(&local_278,times);
        boost::
        adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
        ::~adjacency_list(&local_278);
        boost::
        adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
        ::~adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                           *)local_240);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_298,"run",(allocator *)((long)&G_2.m_property.px + 7));
        sVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count(local_b0,(key_type *)local_298);
        std::__cxx11::string::~string(local_298);
        std::allocator<char>::~allocator((allocator<char> *)((long)&G_2.m_property.px + 7));
        if (sVar3 != 0) {
          boost::
          adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
          ::adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                            *)local_2d8,&local_2d9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_300,"random",&local_301);
          sVar3 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  ::count(local_b0,(key_type *)local_300);
          std::__cxx11::string::~string(local_300);
          std::allocator<char>::~allocator((allocator<char> *)&local_301);
          if (sVar3 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_360,"grid",&local_361);
            sVar3 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    ::count(local_b0,(key_type *)local_360);
            std::__cxx11::string::~string(local_360);
            std::allocator<char>::~allocator((allocator<char> *)&local_361);
            if (sVar3 != 0) {
              poVar4 = std::operator<<((ostream *)&std::cout,"[i] Grid graph ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,nodes);
              poVar4 = std::operator<<(poVar4,"x");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,nodes);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              createGridGraph(&local_3a0,(int)nodes,minWeight,maxWeight);
              boost::
              adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
              ::operator=((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                           *)local_2d8,&local_3a0);
              boost::
              adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
              ::~adjacency_list(&local_3a0);
              goto LAB_00107d35;
            }
            argv_local._4_4_ = 0;
            bVar6 = true;
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,"[i] Random graph ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,nodes);
            poVar4 = std::operator<<(poVar4,"x");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,edges);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            createRandomGraph(&local_340,nodes,edges,minWeight,maxWeight);
            boost::
            adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
            ::operator=((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                         *)local_2d8,&local_340);
            boost::
            adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
            ::~adjacency_list(&local_340);
LAB_00107d35:
            puVar5 = (pointer)boost::
                              num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config>>
                                        ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                                          *)local_2d8);
            this = (allocator<unsigned_long> *)
                   ((long)&dist.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7);
            pred.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = puVar5;
            std::allocator<unsigned_long>::allocator(this);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3c8,
                       (size_type)puVar5,this);
            std::allocator<unsigned_long>::~allocator
                      ((allocator<unsigned_long> *)
                       ((long)&dist.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7));
            puVar5 = pred.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            local_3f0 = 0x7fffffff;
            this_00 = (allocator<long> *)((long)&weight.tag + 7);
            std::allocator<long>::allocator(this_00);
            std::vector<long,_std::allocator<long>_>::vector
                      ((vector<long,_std::allocator<long>_> *)local_3e8,(size_type)puVar5,&local_3f0
                       ,this_00);
            std::allocator<long>::~allocator((allocator<long> *)((long)&weight.tag + 7));
            local_400.tag =
                 (offset_in_EdgeProperties_to_int)
                 boost::
                 get<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config>,int_EdgeProperties::*>
                           (0,(adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                               *)local_2d8);
            boost::
            adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
            ::adjacency_list(&local_438,
                             (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                              *)local_2d8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_458,"graph.dot",
                       (allocator *)
                       ((long)&label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7));
            printGraphVizToFile(&local_438,(string *)local_458);
            std::__cxx11::string::~string(local_458);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7));
            boost::
            adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
            ::~adjacency_list(&local_438);
            label.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._0_4_ = 0;
            label.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._6_1_ =
                 bellmanFord((Graph *)local_2d8,
                             (int *)&label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage,&local_400,
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3c8,
                             (vector<long,_std::allocator<long>_> *)local_3e8);
            if (!(bool)label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._6_1_) {
              poVar4 = std::operator<<((ostream *)&std::cout,"negative cycle detected");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            }
            local_47c = 0;
            CHECK_BELLMAN_FORD((vector<int,_std::allocator<int>_> *)local_478,(Graph *)local_2d8,
                               &local_47c,&local_400,
                               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3c8,
                               (vector<long,_std::allocator<long>_> *)local_3e8);
            poVar4 = std::operator<<((ostream *)&std::cout,"[+] Test OK!");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            boost::
            adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
            ::adjacency_list(&local_4b8,
                             (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                              *)local_2d8);
            std::vector<long,_std::allocator<long>_>::vector
                      (&local_4d0,(vector<long,_std::allocator<long>_> *)local_3e8);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      (&local_4e8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3c8
                      );
            std::vector<int,_std::allocator<int>_>::vector
                      (&local_500,(vector<int,_std::allocator<int>_> *)local_478);
            printGraphShortestPath(&local_4b8,&local_4d0,&local_4e8,&local_500);
            std::vector<int,_std::allocator<int>_>::~vector(&local_500);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_4e8);
            std::vector<long,_std::allocator<long>_>::~vector(&local_4d0);
            boost::
            adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
            ::~adjacency_list(&local_4b8);
            boost::
            adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
            ::adjacency_list(&local_538,
                             (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                              *)local_2d8);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      (&local_550,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3c8
                      );
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_570,"shortest-path.dot",&local_571);
            printGraphShortestPathVizToFile(&local_538,&local_550,(string *)local_570);
            std::__cxx11::string::~string(local_570);
            std::allocator<char>::~allocator((allocator<char> *)&local_571);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_550);
            boost::
            adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
            ::~adjacency_list(&local_538);
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "Run the following (if you have graphviz installed) to see the graph images:"
                                    );
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "  neato -Tpng graph.dot -o graph.png && xdg-open  graph.png");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "  neato -Tpng shortest-path.dot -o shortest-path.png && xdg-open shortest-path.png"
                                    );
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)local_478);
            std::vector<long,_std::allocator<long>_>::~vector
                      ((vector<long,_std::allocator<long>_> *)local_3e8);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3c8);
            bVar6 = false;
          }
          boost::
          adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
          ::~adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                             *)local_2d8);
          if (bVar6) goto LAB_001083bb;
        }
      }
    }
  }
  else {
    testAll();
  }
  argv_local._4_4_ = 0;
LAB_001083bb:
  boost::program_options::variables_map::~variables_map(local_c0);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    const int INF = (std::numeric_limits < int >::max)();
    nodes = 100;
    times = 1;
    minWeight = -100;
    maxWeight = 10000;

    boost::program_options::variables_map args = parseArguments(argc, argv);
    if (edges==0) {
        edges = static_cast<unsigned long>(20 * nodes * log10(nodes));
    }

    if (args.count("test")) {
        testAll();
    }
    else if (args.count("benchmark") && args.count("random")) {
        Graph G = createRandomGraph(nodes, edges, minWeight, maxWeight);
        std::cout << "[i] Benchmark random graph " << nodes << "x" << edges << std::endl;
        benchmark(G, times);
    }
    else if (args.count("benchmark") && args.count("grid")) {
        Graph G = createGridGraph(static_cast<int>(nodes), minWeight, maxWeight);
        std::cout << "[i] Benchmark grid graph " << nodes << "x" << nodes << std::endl;
        benchmark(G, times);
    }
    else if (args.count("run")) {
        Graph G;
        if (args.count("random")) {
            std::cout << "[i] Random graph " << nodes << "x" << edges << std::endl;
            G = createRandomGraph(nodes, edges, minWeight, maxWeight);
        }
        else if (args.count("grid")) {
            std::cout << "[i] Grid graph " << nodes << "x" << nodes << std::endl;
            G = createGridGraph(static_cast<int>(nodes), minWeight, maxWeight);
        }
        else {
            return 0;
        }

        unsigned long  N = num_vertices(G);
        std::vector<unsigned long> pred(N);
        std::vector<long> dist(N, INF);
        WeightMap weight = get(&EdgeProperties::weight, G);
        printGraphVizToFile(G, "graph.dot");
        bool res = bellmanFord(G, 0, weight, pred, dist);
        if (!res) {
            std::cout << "negative cycle detected" << std::endl;
        }
        std::vector<int> label = CHECK_BELLMAN_FORD(G, 0, weight, pred, dist);
        std::cout << "[+] Test OK!" << std::endl;
        printGraphShortestPath(G, dist, pred, label);
        printGraphShortestPathVizToFile(G, pred, "shortest-path.dot");
        std::cout << "Run the following (if you have graphviz installed) to see the graph images:" << std::endl;
        std::cout << "  neato -Tpng graph.dot -o graph.png && xdg-open  graph.png" << std::endl;
        std::cout << "  neato -Tpng shortest-path.dot -o shortest-path.png && xdg-open shortest-path.png" << std::endl;
    }

    return 0;
}